

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# checked.h
# Opt level: O0

char * utf8::append<char*>(uint32_t cp,char *result)

{
  bool bVar1;
  byte bVar2;
  invalid_code_point *this;
  char *local_18;
  char *result_local;
  uint32_t cp_local;
  
  bVar1 = internal::is_code_point_valid<unsigned_int>(cp);
  if (bVar1) {
    bVar2 = (byte)cp;
    if (cp < 0x80) {
      local_18 = result + 1;
      *result = bVar2;
    }
    else if (cp < 0x800) {
      *result = (byte)(cp >> 6) | 0xc0;
      local_18 = result + 2;
      result[1] = bVar2 & 0x3f | 0x80;
    }
    else if (cp < 0x10000) {
      *result = (byte)(cp >> 0xc) | 0xe0;
      result[1] = (byte)(cp >> 6) & 0x3f | 0x80;
      local_18 = result + 3;
      result[2] = bVar2 & 0x3f | 0x80;
    }
    else {
      *result = (byte)(cp >> 0x12) | 0xf0;
      result[1] = (byte)(cp >> 0xc) & 0x3f | 0x80;
      result[2] = (byte)(cp >> 6) & 0x3f | 0x80;
      local_18 = result + 4;
      result[3] = bVar2 & 0x3f | 0x80;
    }
    return local_18;
  }
  this = (invalid_code_point *)__cxa_allocate_exception(0x10);
  invalid_code_point::invalid_code_point(this,cp);
  __cxa_throw(this,&invalid_code_point::typeinfo,invalid_code_point::~invalid_code_point);
}

Assistant:

octet_iterator append(uint32_t cp, octet_iterator result)
    {
        if (!utf8::internal::is_code_point_valid(cp))
            throw invalid_code_point(cp);

        if (cp < 0x80)                        // one octet
            *(result++) = static_cast<uint8_t>(cp);
        else if (cp < 0x800) {                // two octets
            *(result++) = static_cast<uint8_t>((cp >> 6)            | 0xc0);
            *(result++) = static_cast<uint8_t>((cp & 0x3f)          | 0x80);
        }
        else if (cp < 0x10000) {              // three octets
            *(result++) = static_cast<uint8_t>((cp >> 12)           | 0xe0);
            *(result++) = static_cast<uint8_t>(((cp >> 6) & 0x3f)   | 0x80);
            *(result++) = static_cast<uint8_t>((cp & 0x3f)          | 0x80);
        }
        else {                                // four octets
            *(result++) = static_cast<uint8_t>((cp >> 18)           | 0xf0);
            *(result++) = static_cast<uint8_t>(((cp >> 12) & 0x3f)  | 0x80);
            *(result++) = static_cast<uint8_t>(((cp >> 6) & 0x3f)   | 0x80);
            *(result++) = static_cast<uint8_t>((cp & 0x3f)          | 0x80);
        }
        return result;
    }